

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

int __thiscall doctest::Context::run(Context *this)

{
  int *piVar1;
  pointer *pppIVar2;
  pointer pvVar3;
  iterator __position;
  const_iterator __position_00;
  pointer ppIVar4;
  ContextState *pCVar5;
  vector<doctest::String,_std::allocator<doctest::String>_> *filters;
  iterator __last;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  ContextState *pCVar11;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var12;
  size_t sVar13;
  const_iterator cVar14;
  uint uVar15;
  code *__comp;
  _Ios_Openmode _Var16;
  TestCase *pTVar17;
  ContextState *pCVar18;
  undefined1 *puVar19;
  IReporter **curr;
  long lVar20;
  pointer ppIVar21;
  byte bVar22;
  IReporter **curr_rep;
  ulong uVar23;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  char local_389;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_378;
  iterator iStack_370;
  TestCase **local_368;
  undefined1 local_358 [32];
  undefined1 local_338 [136];
  int local_2b0;
  TestCase **local_2a0;
  TestCase *local_298;
  pointer *local_290;
  sigaltstack local_288;
  undefined1 local_270 [16];
  anon_union_24_2_13149d16_for_String_2 local_260;
  TestCase *local_248;
  char local_240 [16];
  ostream local_230 [512];
  
  pCVar11 = detail::g_cs;
  detail::g_cs = this->p;
  is_running_in_test = 1;
  pCVar18 = this->p;
  *(bool *)(in_FS_OFFSET + -0x28) = (pCVar18->super_ContextOptions).no_colors;
  (pCVar18->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar18->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  *(undefined8 *)&(pCVar18->super_ContextOptions).field_0x8c = 0;
  *(undefined8 *)&pCVar18->field_0x94 = 0;
  *(undefined8 *)&pCVar18->field_0x9c = 0;
  pCVar18 = this->p;
  (pCVar18->super_ContextOptions).cout = (ostream *)&std::cout;
  (pCVar18->super_ContextOptions).cerr = (ostream *)&std::cerr;
  std::fstream::fstream(local_240);
  pCVar18 = this->p;
  bVar22 = (pCVar18->super_ContextOptions).out.field_0.buf[0x17];
  if ((char)bVar22 < '\0') {
    uVar15 = (pCVar18->super_ContextOptions).out.field_0.data.size;
  }
  else {
    uVar15 = 0x17 - (bVar22 & 0x1f);
  }
  if (uVar15 != 0) {
    if ((char)bVar22 < '\0') {
      _Var16 = (_Ios_Openmode)*(undefined8 *)&(pCVar18->super_ContextOptions).out.field_0;
    }
    else {
      _Var16 = (int)pCVar18 + (_S_trunc|_S_out);
    }
    std::fstream::open(local_240,_Var16);
    (this->p->super_ContextOptions).cout = local_230;
  }
  pCVar18 = (anonymous_namespace)::FatalConditionHandler::altStackSize;
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       (pointer)operator_new__((ulong)(anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar3 = (this->p->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar3[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar3[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    String::String((String *)local_338,"console",7);
    pCVar18 = (ContextState *)(pvVar3 + 8);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)pCVar18,
               (String *)local_338);
    if (((long)local_338._16_8_ < 0) &&
       (pCVar18 = (ContextState *)local_338._0_8_,
       (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
      operator_delete__((void *)local_338._0_8_);
    }
  }
  local_358._24_8_ = pCVar11;
  anon_unknown_14::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar11 = (ContextState *)
              anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar18 = pCVar11;
      if ((pCVar18->super_ContextOptions).out.field_0.buf[0xf] < '\0') {
        pTVar17 = (pCVar18->super_ContextOptions).currentTest;
      }
      else {
        pTVar17 = (TestCase *)&(pCVar18->super_ContextOptions).currentTest;
      }
      pCVar11 = this->p;
      bVar7 = anon_unknown_14::matchesAny
                        ((char *)pTVar17,
                         (pCVar11->filters).
                         super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8,false,
                         (pCVar11->super_ContextOptions).case_sensitive);
      if (bVar7) {
        local_338._0_8_ =
             (**(code **)((long)&(pCVar18->super_ContextOptions).out.field_0 + 0x10))(detail::g_cs);
        __position._M_current =
             (pCVar11->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pCVar11->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
          _M_realloc_insert<doctest::IReporter*>
                    ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                     &pCVar11->reporters_currently_used,__position,(IReporter **)local_338);
        }
        else {
          *__position._M_current = (IReporter *)local_338._0_8_;
          pppIVar2 = &(pCVar11->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar2 = *pppIVar2 + 1;
        }
      }
      pCVar11 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar18);
    } while (pCVar11 !=
             (ContextState *)&anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  anon_unknown_14::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar11 = (ContextState *)
              anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar18 = pCVar11;
      pCVar11 = this->p;
      __position_00._M_current =
           (pCVar11->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338._0_8_ =
           (**(code **)((long)&(pCVar18->super_ContextOptions).out.field_0 + 0x10))(detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar11->reporters_currently_used,__position_00,(value_type *)local_338);
      pCVar11 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar18);
    } while (pCVar11 !=
             (ContextState *)&anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  pCVar11 = this->p;
  if (((((pCVar11->super_ContextOptions).no_run != false) ||
       ((pCVar11->super_ContextOptions).version != false)) ||
      ((pCVar11->super_ContextOptions).help != false)) ||
     ((pCVar11->super_ContextOptions).list_reporters == true)) {
    ppIVar21 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar4 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar21 != ppIVar4) {
      do {
        local_338._0_8_ = (ContextState *)0x0;
        local_338._8_8_ = (void *)0x0;
        local_338._16_8_ = 0;
        (**(*ppIVar21)->_vptr_IReporter)(*ppIVar21,local_338);
        ppIVar21 = ppIVar21 + 1;
      } while (ppIVar21 != ppIVar4);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (pointer)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar8 = std::__basic_file<char>::is_open();
    uVar6 = local_358._24_8_;
    if (cVar8 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = (ContextState *)uVar6;
    is_running_in_test = 0;
    ppIVar4 = (this->p->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar21 = (this->p->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
        ppIVar21 = ppIVar21 + 1) {
      if (*ppIVar21 != (IReporter *)0x0) {
        (*(*ppIVar21)->_vptr_IReporter[0xd])();
      }
    }
    pCVar18 = this->p;
    ppIVar21 = (pCVar18->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar18->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar21) {
      (pCVar18->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar21;
    }
    if ((*(int *)&pCVar18->field_0x98 == 0) ||
       (iVar10 = 1, (pCVar18->super_ContextOptions).no_exitcode == true)) {
      iVar10 = 0;
    }
    goto LAB_0010a674;
  }
  local_378._M_current = (TestCase **)0x0;
  iStack_370._M_current = (TestCase **)0x0;
  local_368 = (TestCase **)0x0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar11 = (ContextState *)
              detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pCVar18 = pCVar11;
      local_338._0_8_ = (long)&(pCVar18->super_ContextOptions).binary_name.field_0 + 0x10;
      if (iStack_370._M_current == local_368) {
        std::
        vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>::
        _M_realloc_insert<doctest::detail::TestCase_const*>
                  ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                    *)&local_378,iStack_370,(TestCase **)local_338);
      }
      else {
        *iStack_370._M_current = (TestCase *)local_338._0_8_;
        iStack_370._M_current = iStack_370._M_current + 1;
      }
      pCVar11 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar18);
    } while (pCVar11 !=
             (ContextState *)&detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = iStack_370._M_current;
  _Var12._M_current = local_378._M_current;
  pCVar11 = this->p;
  *(int *)&(pCVar11->super_ContextOptions).field_0x8c =
       (int)((ulong)((long)iStack_370._M_current - (long)local_378._M_current) >> 3);
  if (iStack_370._M_current != local_378._M_current) {
    pCVar18 = (ContextState *)&(pCVar11->super_ContextOptions).order_by;
    iVar10 = String::compare((String *)pCVar18,"file",true);
    if (iVar10 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar10 = String::compare((String *)pCVar18,"suite",true);
      if (iVar10 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar10 = String::compare((String *)pCVar18,"name",true);
        if (iVar10 != 0) {
          iVar10 = String::compare((String *)pCVar18,"rand",true);
          if (iVar10 == 0) {
            uVar15 = (pCVar11->super_ContextOptions).rand_seed;
            pCVar18 = (ContextState *)(ulong)uVar15;
            srand(uVar15);
            _Var12._M_current = local_378._M_current;
            for (uVar23 = (long)iStack_370._M_current - (long)local_378._M_current >> 3; uVar23 != 1
                ; uVar23 = uVar23 - 1) {
              iVar10 = rand();
              pTVar17 = _Var12._M_current[uVar23 - 1];
              iVar10 = (int)((ulong)(long)iVar10 % uVar23);
              _Var12._M_current[uVar23 - 1] = _Var12._M_current[iVar10];
              _Var12._M_current[iVar10] = pTVar17;
            }
          }
          goto LAB_0010a7fc;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var12,(__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                       )__last._M_current,__comp);
    pCVar18 = (ContextState *)_Var12._M_current;
  }
LAB_0010a7fc:
  local_260._8_8_ = local_270 + 8;
  local_270._8_4_ = _S_red;
  local_260.data.ptr = (char *)0x0;
  local_248 = (TestCase *)0x0;
  pCVar11 = this->p;
  local_389 = '\x01';
  if (((pCVar11->super_ContextOptions).count == false) &&
     ((pCVar11->super_ContextOptions).list_test_cases == false)) {
    local_389 = (pCVar11->super_ContextOptions).list_test_suites;
  }
  local_358._0_8_ = (ostream *)0x0;
  local_358._8_8_ = (ostream *)0x0;
  local_358._16_8_ = (TestCaseData **)0x0;
  local_260._16_8_ = local_260._8_8_;
  if (local_389 == '\0') {
    ppIVar4 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar21 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
        ppIVar21 = ppIVar21 + 1) {
      pCVar18 = (ContextState *)*ppIVar21;
      (**(code **)((pCVar18->super_ContextOptions).cout + 8))();
    }
  }
  local_2a0 = iStack_370._M_current;
  _Var12._M_current = local_378._M_current;
  if (local_378._M_current != iStack_370._M_current) {
    do {
      pCVar11 = (ContextState *)*_Var12._M_current;
      if ((pCVar11->super_ContextOptions).out.field_0.buf[8] == '\x01') {
        bVar22 = (this->p->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar22 = 0;
      }
      pCVar18 = pCVar11;
      if ((pCVar11->super_ContextOptions).binary_name.field_0.buf[7] < '\0') {
        pCVar18 = (ContextState *)(pCVar11->super_ContextOptions).cout;
      }
      pCVar5 = this->p;
      filters = (pCVar5->filters).
                super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar7 = (pCVar5->super_ContextOptions).case_sensitive;
      local_290 = (pointer *)_Var12._M_current;
      bVar9 = anon_unknown_14::matchesAny((char *)pCVar18,filters,true,bVar7);
      if (!bVar9) {
        bVar22 = 1;
      }
      bVar9 = anon_unknown_14::matchesAny((char *)pCVar18,filters + 1,false,bVar7);
      if (bVar9) {
        bVar22 = 1;
      }
      pTVar17 = (pCVar11->super_ContextOptions).currentTest;
      bVar9 = anon_unknown_14::matchesAny((char *)pTVar17,filters + 2,true,bVar7);
      if (!bVar9) {
        bVar22 = 1;
      }
      local_298 = pTVar17;
      bVar9 = anon_unknown_14::matchesAny((char *)pTVar17,filters + 3,false,bVar7);
      if (bVar9) {
        bVar22 = 1;
      }
      pCVar18 = *(ContextState **)
                 ((long)&(pCVar11->super_ContextOptions).binary_name.field_0 + 0x10);
      bVar9 = anon_unknown_14::matchesAny((char *)pCVar18,filters + 4,true,bVar7);
      if (!bVar9) {
        bVar22 = 1;
      }
      bVar7 = anon_unknown_14::matchesAny((char *)pCVar18,filters + 5,false,bVar7);
      pTVar17 = local_298;
      if (bVar7) {
        bVar22 = 1;
      }
      if ((bVar22 & 1) == 0) {
        *(int *)&pCVar5->field_0x90 = *(int *)&pCVar5->field_0x90 + 1;
      }
      uVar15 = (pCVar5->super_ContextOptions).last;
      if (((uVar15 < *(uint *)&pCVar5->field_0x90) &&
          ((pCVar5->super_ContextOptions).first <= uVar15)) ||
         (*(uint *)&pCVar5->field_0x90 < (pCVar5->super_ContextOptions).first)) {
        bVar22 = 1;
      }
      bVar7 = false;
      if ((bVar22 & 1) == 0) {
        if ((pCVar5->super_ContextOptions).count == false) {
          if ((pCVar5->super_ContextOptions).list_test_cases == true) {
            if (local_358._8_8_ == local_358._16_8_) {
              pCVar18 = (ContextState *)local_358;
              local_338._0_8_ = pCVar11;
              std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
              ::_M_realloc_insert<doctest::TestCaseData_const*>
                        ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                          *)pCVar18,(iterator)local_358._8_8_,(TestCaseData **)local_338);
            }
            else {
              *(ContextState **)local_358._8_8_ = pCVar11;
              local_358._8_8_ = local_358._8_8_ + 8;
              local_338._0_8_ = pCVar11;
            }
          }
          else if ((pCVar5->super_ContextOptions).list_test_suites == true) {
            sVar13 = strlen((char *)local_298);
            String::String((String *)local_338,(char *)pTVar17,(uint)sVar13);
            pCVar18 = (ContextState *)local_270;
            cVar14 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                             *)pCVar18,(String *)local_338);
            if (cVar14._M_node == (_Base_ptr)(local_270 + 8)) {
              cVar8 = (((pCVar11->super_ContextOptions).currentTest)->super_TestCaseData).m_file.
                      field_0.buf[0];
              if (((long)local_338._16_8_ < 0) &&
                 (pCVar18 = (ContextState *)local_338._0_8_,
                 (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                operator_delete__((void *)local_338._0_8_);
              }
              if (cVar8 != '\0') {
                local_338._0_8_ = pCVar11;
                std::
                vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                ::push_back((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                             *)local_358,(value_type *)local_338);
                pTVar17 = (pCVar11->super_ContextOptions).currentTest;
                sVar13 = strlen((char *)pTVar17);
                String::String((String *)local_338,(char *)pTVar17,(uint)sVar13);
                pCVar18 = (ContextState *)local_270;
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>
                          ((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                            *)pCVar18,(String *)local_338);
                if (((long)local_338._16_8_ < 0) &&
                   (pCVar18 = (ContextState *)local_338._0_8_,
                   (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                  operator_delete__((void *)local_338._0_8_);
                }
                puVar19 = &this->p->field_0x94;
                *(int *)puVar19 = *(int *)puVar19 + 1;
              }
            }
            else if (((long)local_338._16_8_ < 0) &&
                    (pCVar18 = (ContextState *)local_338._0_8_,
                    (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
              operator_delete__((void *)local_338._0_8_);
            }
          }
          else {
            (pCVar5->super_ContextOptions).currentTest = (TestCase *)pCVar11;
            (pCVar5->super_CurrentTestCaseStats).failure_flags = 0;
            (pCVar5->super_CurrentTestCaseStats).seconds = 0.0;
            LOCK();
            (pCVar5->numAssertsFailedCurrentTest_atomic).super___atomic_base<int>._M_i = 0;
            UNLOCK();
            LOCK();
            (this->p->numAssertsCurrentTest_atomic).super___atomic_base<int>._M_i = 0;
            UNLOCK();
            std::
            _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::clear(&(this->p->subcasesPassed)._M_t);
            ppIVar4 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar21 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
                ppIVar21 = ppIVar21 + 1) {
              (*(*ppIVar21)->_vptr_IReporter[3])();
            }
            pCVar18 = this->p;
            gettimeofday((timeval *)local_338,(__timezone_ptr_t)0x0);
            (pCVar18->timer).m_ticks = (ticks_t)(local_338._0_8_ * 1000000 + local_338._8_8_);
            bVar7 = true;
            do {
              pCVar18 = this->p;
              pCVar18->should_reenter = false;
              pCVar18->subcasesCurrentMaxLevel = 0;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&pCVar18->subcasesStack,
                              (pCVar18->subcasesStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              LOCK();
              (this->p->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (size_t)(anonymous_namespace)::FatalConditionHandler::altStackSize
              ;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset((sigaction *)local_338,0,0x98);
              local_338._0_8_ = anon_unknown_14::FatalConditionHandler::handleSignal;
              local_2b0 = 0x8000000;
              puVar19 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar20 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar20),
                          (sigaction *)local_338,(sigaction *)puVar19);
                lVar20 = lVar20 + 0x10;
                puVar19 = (undefined1 *)((long)puVar19 + 0x98);
              } while (lVar20 != 0x60);
              (**(code **)((long)&(pCVar11->super_ContextOptions).order_by.field_0 + 8))();
              anon_unknown_14::FatalConditionHandler::reset();
              anon_unknown_14::FatalConditionHandler::reset();
              pCVar18 = this->p;
              if ((0 < (pCVar18->super_ContextOptions).abort_after) &&
                 ((this->p->super_ContextOptions).abort_after <=
                  (pCVar18->numAssertsFailedCurrentTest_atomic).super___atomic_base<int>._M_i +
                  *(int *)&pCVar18->field_0xa0)) {
                piVar1 = &(this->p->super_CurrentTestCaseStats).failure_flags;
                *(byte *)piVar1 = (byte)*piVar1 | 8;
                bVar7 = false;
              }
              if ((this->p->should_reenter == true) && (bVar7)) {
                ppIVar4 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppIVar21 = (detail::g_cs->reporters_currently_used).
                                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
                    ppIVar21 = ppIVar21 + 1) {
                  (*(*ppIVar21)->_vptr_IReporter[4])(*ppIVar21,pCVar11);
                }
              }
              pCVar18 = this->p;
              if (pCVar18->should_reenter == false) {
                bVar7 = false;
              }
            } while (bVar7);
            detail::ContextState::finalizeTestCaseData(pCVar18);
            ppIVar4 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar21 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
                ppIVar21 = ppIVar21 + 1) {
              pCVar18 = (ContextState *)*ppIVar21;
              (**(code **)((pCVar18->super_ContextOptions).cout + 0x28))
                        (pCVar18,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar11 = this->p;
            (pCVar11->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar10 = (pCVar11->super_ContextOptions).abort_after;
            if ((iVar10 < 1) || (bVar7 = true, *(int *)&pCVar11->field_0xa0 < iVar10)) {
              bVar7 = false;
            }
          }
        }
      }
      else if (local_389 == '\0') {
        ppIVar4 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar21 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
            ppIVar21 = ppIVar21 + 1) {
          pCVar18 = (ContextState *)*ppIVar21;
          (**(code **)((pCVar18->super_ContextOptions).cout + 0x58))(pCVar18,pCVar11);
        }
      }
    } while ((!bVar7) &&
            (_Var12._M_current = (TestCase **)(local_290 + 1),
            (TestCase **)(local_290 + 1) != local_2a0));
  }
  if (local_389 == '\0') {
    ppIVar4 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar21 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
        ppIVar21 = ppIVar21 + 1) {
      pCVar18 = (ContextState *)*ppIVar21;
      (**(code **)((pCVar18->super_ContextOptions).cout + 0x10))
                (pCVar18,&(detail::g_cs->super_ContextOptions).field_0x8c);
    }
  }
  else {
    local_338._0_8_ = &(detail::g_cs->super_ContextOptions).field_0x8c;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338._0_8_ = (ContextState *)0x0;
    }
    local_338._8_8_ = local_358._0_8_;
    local_338._16_4_ = (int)((ulong)(local_358._8_8_ - local_358._0_8_) >> 3);
    ppIVar21 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar4 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar21 != ppIVar4) {
      do {
        pCVar18 = (ContextState *)*ppIVar21;
        (**(code **)(pCVar18->super_ContextOptions).cout)(pCVar18,local_338);
        ppIVar21 = ppIVar21 + 1;
      } while (ppIVar21 != ppIVar4);
    }
  }
  run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)pCVar18);
  uVar6 = local_358._24_8_;
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (pointer)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = (ContextState *)uVar6;
  is_running_in_test = 0;
  ppIVar4 = (this->p->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar21 = (this->p->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppIVar21 != ppIVar4;
      ppIVar21 = ppIVar21 + 1) {
    if (*ppIVar21 != (IReporter *)0x0) {
      (*(*ppIVar21)->_vptr_IReporter[0xd])();
    }
  }
  pCVar18 = this->p;
  ppIVar21 = (pCVar18->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((pCVar18->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar21) {
    (pCVar18->reporters_currently_used).
    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar21;
  }
  if ((*(int *)&pCVar18->field_0x98 == 0) ||
     (iVar10 = 1, (pCVar18->super_ContextOptions).no_exitcode == true)) {
    iVar10 = 0;
  }
  if ((ostream *)local_358._0_8_ != (ostream *)0x0) {
    operator_delete((void *)local_358._0_8_,local_358._16_8_ - local_358._0_8_);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
               *)local_270);
  if (local_378._M_current != (TestCase **)0x0) {
    operator_delete(local_378._M_current,(long)local_368 - (long)local_378._M_current);
  }
LAB_0010a674:
  std::fstream::~fstream(local_240);
  return iVar10;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    // stdout by default
    p->cout = &std::cout;
    p->cerr = &std::cerr;

    // or to a file if specified
    std::fstream fstr;
    if(p->out.size()) {
        fstr.open(p->out.c_str(), std::fstream::out);
        p->cout = &fstr;
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}